

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O1

bool Common2Mjd(COMMONTIME UT,MJDTIME *MJD)

{
  bool bVar1;
  int iVar2;
  ushort uVar3;
  double dVar4;
  
  bVar1 = (bool)(-(UT.Sec <= 60.0) & -(0.0 <= UT.Sec) &
                (UT.Min < 0x3d && (UT.Hour < 0x19 && UT.Day < 0x20)));
  if (bVar1 == true) {
    uVar3 = UT.Month | 0xc;
    if (2 < UT.Month) {
      uVar3 = UT.Month;
    }
    dVar4 = (UT.Sec / 3600.0 + (double)UT.Min / 60.0 + (double)UT.Hour) / 24.0 + MJD->FracDay;
    MJD->FracDay = dVar4;
    iVar2 = (int)((double)(uVar3 + 1) * 30.6001) +
            (int)((double)(ushort)(UT.Year - (UT.Month < 3)) * 365.25) + (uint)UT.Day + -0xa5c6b;
    MJD->Day = iVar2;
    if (1.0 <= dVar4) {
      MJD->Day = iVar2 + (int)dVar4;
      MJD->FracDay = dVar4 - (double)(int)dVar4;
    }
  }
  return bVar1;
}

Assistant:

bool Common2Mjd(const COMMONTIME UT, MJDTIME &MJD)
{
    bool flag;
    unsigned short int y, m;

    // 输入合法性检测
    flag = isLegal(UT);
    if(!flag)
        return flag;

    if(UT.Month <= 2)
    {
        y = UT.Year - 1;
        m = UT.Month + 12;
    }
    else
    {
        y = UT.Year;
        m = UT.Month;
    }
    MJD.Day = int(365.25 * y) + int(30.6001 * (m + 1)) + UT.Day + 1720981;
    MJD.FracDay += (UT.Hour + UT.Min / 60.0 + (UT.Sec) / 3600.0) / 24.0;
    MJD.Day -= 2400000;
    // FracDay 合法性检测
    if(MJD.FracDay >= 1)
    {
        MJD.Day += int(MJD.FracDay);
        MJD.FracDay -= int(MJD.FracDay);
    }
    flag = true;

    return flag;
}